

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::String::_opNumber
          (String *this,ModifyOp op,uint64_t i,uint32_t base,size_t width,StringFormatFlags flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *__dest;
  char cVar5;
  uint64_t uVar6;
  Error EVar7;
  uint uVar8;
  size_t __n;
  undefined1 *puVar9;
  size_t __n_00;
  ulong uVar10;
  undefined1 *__src;
  bool bVar11;
  long lStack_d0;
  char buf [128];
  undefined1 local_38 [8];
  
  uVar8 = 10;
  if (base != 0) {
    uVar8 = base;
  }
  if ((long)i < 0 && (int)flags < 0) {
    cVar5 = '-';
    bVar11 = false;
    uVar6 = -i;
  }
  else {
    uVar6 = i;
    if ((flags & kShowSign) == kNone) {
      bVar11 = (flags & kShowSpace) == kNone;
      cVar5 = (char)(flags & kShowSpace) << 4;
    }
    else {
      cVar5 = '+';
      bVar11 = false;
    }
  }
  uVar3 = uVar8 - 2 >> 1 | (uint)((uVar8 - 2 & 1) != 0) << 0x1f;
  EVar7 = 2;
  if (7 < uVar3) {
    return 2;
  }
  puVar9 = local_38;
  switch(uVar3) {
  case 0:
  case 3:
  case 7:
    iVar2 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
      }
    }
    do {
      uVar10 = uVar6 >> ((byte)iVar2 & 0x3f);
      puVar9[-1] = "0123456789ABCDEF"[(uint)uVar6 & uVar8 - 1];
      puVar9 = puVar9 + -1;
      uVar6 = uVar10;
    } while (uVar10 != 0);
    break;
  default:
    goto switchD_001247cf_caseD_1;
  case 4:
    do {
      puVar9[-1] = (byte)(uVar6 % 10) | 0x30;
      puVar9 = puVar9 + -1;
      bVar1 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar1);
  }
  __src = puVar9;
  if ((flags & kAlternate) != kNone) {
    if (i == 0 || uVar8 != 8) {
      if (uVar8 != 0x10) goto LAB_00124872;
      puVar9[-1] = 0x78;
      lStack_d0 = -2;
    }
    else {
      lStack_d0 = -1;
    }
    puVar9[lStack_d0] = 0x30;
    __src = puVar9 + lStack_d0;
  }
LAB_00124872:
  uVar10 = (long)local_38 - (long)puVar9;
  if (!bVar11) {
    __src[-1] = cVar5;
    __src = __src + -1;
  }
  uVar4 = 0x100;
  if (width < 0x100) {
    uVar4 = width;
  }
  EVar7 = 0;
  __n = 0;
  if (uVar10 <= uVar4) {
    __n = uVar4 - uVar10;
  }
  __n_00 = (long)puVar9 - (long)__src;
  __dest = prepare(this,op,uVar10 + __n_00 + __n);
  if (__dest == (char *)0x0) {
    EVar7 = 1;
  }
  else {
    memcpy(__dest,__src,__n_00);
    memset(__dest + __n_00,0x30,__n);
    memcpy(__dest + __n_00 + __n,__src + __n_00,uVar10);
  }
switchD_001247cf_caseD_1:
  return EVar7;
}

Assistant:

Error String::_opNumber(ModifyOp op, uint64_t i, uint32_t base, size_t width, StringFormatFlags flags) noexcept {
  if (base == 0)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // Format Sign
  // -----------

  if (Support::test(flags, StringFormatFlags::kSigned) && int64_t(i) < 0) {
    i = uint64_t(-int64_t(i));
    sign = '-';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSign)) {
    sign = '+';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSpace)) {
    sign = ' ';
  }

  // Format Number
  // -------------

  switch (base) {
    case 2:
    case 8:
    case 16: {
      uint32_t shift = Support::ctz(base);
      uint32_t mask = base - 1;

      do {
        uint64_t d = i >> shift;
        size_t r = size_t(i & mask);

        *--p = String_baseN[r];
        i = d;
      } while (i);

      break;
    }

    case 10: {
      do {
        uint64_t d = i / 10;
        uint64_t r = i % 10;

        *--p = char(uint32_t('0') + uint32_t(r));
        i = d;
      } while (i);

      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  size_t numberSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // Alternate Form
  // --------------

  if (Support::test(flags, StringFormatFlags::kAlternate)) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // String Width
  // ------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberSize)
    width = 0;
  else
    width -= numberSize;

  // Finalize
  // --------

  size_t prefixSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberSize;
  char* data = prepare(op, prefixSize + width + numberSize);

  if (!data)
    return DebugUtils::errored(kErrorOutOfMemory);

  memcpy(data, p, prefixSize);
  data += prefixSize;

  memset(data, '0', width);
  data += width;

  memcpy(data, p + prefixSize, numberSize);
  return kErrorOk;
}